

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

void Js::RegexHelper::PrimBeginMatch
               (RegexMatchState *state,ScriptContext *scriptContext,RegexPattern *pattern,
               char16 *input,CharCount inputLength,bool alwaysNeedAlloc)

{
  char *addr;
  Matcher *pMVar1;
  TempArenaAllocatorObject *pTVar2;
  
  state->input = input;
  if ((pattern->rep).unified.matcher.ptr == (Matcher *)0x0) {
    addr = (char *)((long)&pattern->rep + 8);
    pMVar1 = UnifiedRegex::Matcher::New(scriptContext,pattern);
    Memory::Recycler::WBSetBit(addr);
    (pattern->rep).unified.matcher.ptr = pMVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  if (alwaysNeedAlloc) {
    pTVar2 = ScriptContext::GetTemporaryAllocator(scriptContext,L"RegexUnifiedExecTemp");
  }
  else {
    pTVar2 = (TempArenaAllocatorObject *)0x0;
  }
  state->tempAllocatorObj = pTVar2;
  return;
}

Assistant:

void RegexHelper::PrimBeginMatch(RegexMatchState& state, ScriptContext* scriptContext, UnifiedRegex::RegexPattern* pattern, const char16* input, CharCount inputLength, bool alwaysNeedAlloc)
    {
        state.input = input;
        if (pattern->rep.unified.matcher == 0)
            pattern->rep.unified.matcher = UnifiedRegex::Matcher::New(scriptContext, pattern);
        if (alwaysNeedAlloc)
            state.tempAllocatorObj = scriptContext->GetTemporaryAllocator(_u("RegexUnifiedExecTemp"));
        else
            state.tempAllocatorObj = 0;
    }